

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O1

int arg_analyze(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  
  g_param.msq_key = 0x7045;
  g_param.output_lv = OUTPUT_LV_INFO;
  g_param.speed = 0;
  g_param.option = OPTION_HIGH_PREC;
  g_param.ssm_id = 0;
  builtin_strncpy(g_param.parameter_filename,"./robot.param",0xe);
  builtin_strncpy(g_param.device_name,"/dev/ttyUSB0",0xd);
  if (1 < argc) {
    iVar4 = 1;
    do {
      pcVar1 = argv[iVar4];
      iVar2 = strcmp(pcVar1,"--help");
      if ((iVar2 == 0) || (iVar2 = strcmp(pcVar1,"-h"), iVar2 == 0)) {
        g_param._272_8_ = g_param._272_8_ | 0x800000000;
      }
      else {
        iVar2 = strcmp(pcVar1,"--long-help");
        if (iVar2 == 0) {
          g_param._272_8_ = g_param._272_8_ | 0x1000000000;
        }
        else {
          iVar2 = strcmp(pcVar1,"--daemon");
          if (iVar2 == 0) {
            g_param._272_8_ = g_param._272_8_ | 0x8000000000;
          }
          else {
            iVar2 = strcmp(pcVar1,"--ping");
            if (iVar2 == 0) {
              g_param._272_8_ = g_param._272_8_ | 0x10000000000000;
            }
            else {
              iVar2 = strcmp(pcVar1,"--param-help");
              if (iVar2 == 0) {
                g_param._272_8_ = g_param._272_8_ | 0x2000000000;
              }
              else {
                iVar2 = strcmp(pcVar1,"--show-odometry");
                if ((iVar2 == 0) || (iVar2 = strcmp(pcVar1,"-o"), iVar2 == 0)) {
                  g_param._272_8_ = g_param._272_8_ | 0x100000000;
                }
                else {
                  iVar2 = strcmp(pcVar1,"--show-timestamp");
                  if ((iVar2 == 0) || (iVar2 = strcmp(pcVar1,"-t"), iVar2 == 0)) {
                    g_param._272_8_ = g_param._272_8_ | 0x400000000;
                  }
                  else {
                    iVar2 = strcmp(pcVar1,"--param");
                    if ((iVar2 == 0) || (iVar2 = strcmp(pcVar1,"-p"), iVar2 == 0)) {
                      iVar4 = iVar4 + 1;
                      if (argc <= iVar4) {
LAB_0010c4ca:
                        pcVar3 = "ERROR :  option requires an argument -- \'%s\'.\n";
LAB_0010c4d1:
                        yprintf(OUTPUT_LV_ERROR,pcVar3,pcVar1);
                        return 0;
                      }
                      strcpy(g_param.parameter_filename,argv[iVar4]);
                      g_param._272_8_ = g_param._272_8_ | 0x40000000000;
                    }
                    else {
                      iVar2 = strcmp(pcVar1,"--socket");
                      if (iVar2 == 0) {
                        iVar4 = iVar4 + 1;
                        if (argc <= iVar4) goto LAB_0010c4ca;
                        g_param.port = atoi(argv[iVar4]);
                        g_param._272_8_ = g_param._272_8_ | 0x20000000000;
                      }
                      else {
                        iVar2 = strcmp(pcVar1,"--admask");
                        if (iVar2 == 0) {
                          iVar4 = iVar4 + 1;
                          if (argc <= iVar4) goto LAB_0010c4ca;
                          g_param.admask = '\0';
                          if (*argv[iVar4] != '\0') {
                            g_param.admask = 0;
                            pcVar1 = argv[iVar4];
                            do {
                              pcVar3 = pcVar1 + 1;
                              g_param.admask = g_param.admask * '\x02';
                              if (*pcVar1 == '1') {
                                g_param.admask = g_param.admask | 1;
                              }
                              pcVar1 = pcVar3;
                            } while (*pcVar3 != '\0');
                          }
                        }
                        else {
                          iVar2 = strcmp(pcVar1,"--device");
                          if ((iVar2 == 0) || (iVar2 = strcmp(pcVar1,"-d"), iVar2 == 0)) {
                            iVar4 = iVar4 + 1;
                            if (argc <= iVar4) goto LAB_0010c4ca;
                            strcpy(g_param.device_name,argv[iVar4]);
                          }
                          else {
                            iVar2 = strcmp(pcVar1,"--without-control");
                            if ((iVar2 == 0) || (iVar2 = strcmp(pcVar1,"-c"), iVar2 == 0)) {
                              g_param._272_8_ = g_param._272_8_ | 0x200000000;
                            }
                            else {
                              iVar2 = strcmp(pcVar1,"--without-device");
                              if (iVar2 != 0) {
                                iVar2 = strcmp(pcVar1,"--high-resolution");
                                if ((iVar2 == 0) ||
                                   (iVar2 = strcmp(pcVar1,"--high-resolution=yes"), iVar2 == 0)) {
                                  g_param._272_8_ = g_param._272_8_ | 0x8000000000000;
                                }
                                else {
                                  iVar2 = strcmp(pcVar1,"--high-resolution=no");
                                  if (iVar2 == 0) {
                                    g_param._272_8_ = g_param._272_8_ & 0xfff7ffffffffffff;
                                  }
                                  else {
                                    iVar2 = strcmp(pcVar1,"--version");
                                    if ((iVar2 == 0) || (iVar2 = strcmp(pcVar1,"-v"), iVar2 == 0)) {
                                      g_param._272_8_ = g_param._272_8_ | 0x4000000000;
                                    }
                                    else {
                                      iVar2 = strcmp(pcVar1,"--verbose");
                                      if (iVar2 == 0) {
                                        g_param.output_lv = OUTPUT_LV_DEBUG;
                                      }
                                      else {
                                        iVar2 = strcmp(pcVar1,"--quiet");
                                        if (iVar2 == 0) {
                                          g_param.output_lv = OUTPUT_LV_WARNING;
                                        }
                                        else {
                                          iVar2 = strcmp(pcVar1,"--reconnect");
                                          if (iVar2 == 0) {
                                            g_param._272_8_ = g_param._272_8_ | 0x800000000000;
                                          }
                                          else {
                                            iVar2 = strcmp(pcVar1,"--enable-set-bs");
                                            if (iVar2 == 0) {
                                              g_param._272_8_ = g_param._272_8_ | 0x200000000000;
                                            }
                                            else {
                                              iVar2 = strcmp(pcVar1,"--enable-get-digital-io");
                                              if (iVar2 == 0) {
                                                g_param._272_8_ = g_param._272_8_ | 0x1000000000000;
                                              }
                                              else {
                                                iVar2 = strcmp(pcVar1,"--no-yp-protocol");
                                                if (iVar2 == 0) {
                                                  g_param._272_8_ = g_param._272_8_ | 0x400000000000
                                                  ;
                                                }
                                                else {
                                                  iVar2 = strcmp(pcVar1,"--without-ssm");
                                                  if (iVar2 == 0) {
                                                    g_param._272_8_ =
                                                         g_param._272_8_ | 0x100000000000;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(pcVar1,"--msq-key");
                                                    if ((iVar2 == 0) ||
                                                       (iVar2 = strcmp(pcVar1,"-q"), iVar2 == 0)) {
                                                      iVar4 = iVar4 + 1;
                                                      if (argc <= iVar4) goto LAB_0010c4ca;
                                                      g_param.msq_key = atoi(argv[iVar4]);
                                                    }
                                                    else {
                                                      iVar2 = strcmp(pcVar1,"--speed");
                                                      if ((iVar2 == 0) ||
                                                         (iVar2 = strcmp(pcVar1,"-s"), iVar2 == 0))
                                                      {
                                                        iVar4 = iVar4 + 1;
                                                        if (argc <= iVar4) goto LAB_0010c4ca;
                                                        iVar2 = atoi(argv[iVar4]);
                                                        g_param.speed = iVar2;
                                                      }
                                                      else {
                                                        iVar2 = strcmp(pcVar1,"--passive");
                                                        if (iVar2 == 0) {
                                                          g_param._272_8_ =
                                                               g_param._272_8_ | 0x2000000000000;
                                                        }
                                                        else {
                                                          iVar2 = strcmp(pcVar1,"--update-param");
                                                          if (iVar2 == 0) {
                                                            g_param._272_8_ =
                                                                 g_param._272_8_ | 0x4000000000000;
                                                          }
                                                          else {
                                                            iVar2 = strcmp(pcVar1,"--ssm-id");
                                                            if (iVar2 == 0) {
                                                              iVar4 = iVar4 + 1;
                                                              if (argc <= iVar4) goto LAB_0010c4ca;
                                                              g_param.ssm_id = atoi(argv[iVar4]);
                                                            }
                                                            else {
                                                              iVar2 = strcmp(pcVar1,
                                                  "--exit-on-time-jump");
                                                  if (iVar2 != 0) {
                                                    pcVar3 = "ERROR : invalid option -- \'%s\'.\n";
                                                    goto LAB_0010c4d1;
                                                  }
                                                  g_param._272_8_ =
                                                       g_param._272_8_ | 0x20000000000000;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                                goto LAB_0010c28f;
                              }
                              g_param._272_8_ = g_param._272_8_ | 0x480200000000;
                            }
                            g_state[0] = '\0';
                            g_state[1] = '\0';
                            g_state[2] = '\0';
                            g_state[3] = '\0';
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_0010c28f:
      iVar4 = iVar4 + 1;
    } while (iVar4 < argc);
  }
  return 1;
}

Assistant:

int arg_analyze(int argc, char* argv[])
{
  int i;

  g_param.option = OPTION_DEFAULT;
  g_param.msq_key = YPSPUR_MSQ_KEY;
  g_param.output_lv = OUTPUT_LV_INFO;
  g_param.speed = 0;
  g_param.ssm_id = 0;

  strcpy(g_param.parameter_filename, DEFAULT_PARAMETER_FILE);
  strcpy(g_param.device_name, DEFAULT_DEVICE_NAME);

  for (i = 1; i < argc; i++)
  {
    if (!strcmp(argv[i], "--help") || !strcmp(argv[i], "-h"))
    {
      g_param.option |= OPTION_SHOW_HELP;
    }
    else if (!strcmp(argv[i], "--long-help"))
    {
      g_param.option |= OPTION_SHOW_LONGHELP;
    }
    else if (!strcmp(argv[i], "--daemon"))
    {
      g_param.option |= OPTION_DAEMON;
    }
    else if (!strcmp(argv[i], "--ping"))
    {
      g_param.option |= OPTION_PING;
    }
    else if (!strcmp(argv[i], "--param-help"))
    {
      g_param.option |= OPTION_SHOW_PARAMHELP;
    }
    else if (!strcmp(argv[i], "--show-odometry") || !strcmp(argv[i], "-o"))
    {
      g_param.option |= OPTION_SHOW_ODOMETRY;
    }
    else if (!strcmp(argv[i], "--show-timestamp") || !strcmp(argv[i], "-t"))
    {
      g_param.option |= OPTION_SHOW_TIMESTAMP;
    }
    else if (!strcmp(argv[i], "--param") || !strcmp(argv[i], "-p"))
    {
      if (i + 1 < argc)
      {
        i++;
        strcpy(g_param.parameter_filename, argv[i]);
        g_param.option |= OPTION_PARAM_FILE;
      }
      else
        break;
    }
    else if (!strcmp(argv[i], "--socket"))
    {
      if (i + 1 < argc)
      {
        i++;
        g_param.port = atoi(argv[i]);
        g_param.option |= OPTION_SOCKET;
      }
      else
        break;
    }
    else if (!strcmp(argv[i], "--admask"))
    {
      if (i + 1 < argc)
      {
        char* pos;

        i++;
        g_param.admask = 0;
        for (pos = argv[i]; *pos != 0; pos++)
        {
          g_param.admask = g_param.admask << 1;
          if (*pos == '1')
            g_param.admask |= 1;
        }
      }
      else
        break;
    }
    else if (!strcmp(argv[i], "--device") || !strcmp(argv[i], "-d"))
    {
      if (i + 1 < argc)
      {
        i++;
        strcpy(g_param.device_name, argv[i]);
      }
      else
        break;
    }
    else if (!strcmp(argv[i], "--without-control") || !strcmp(argv[i], "-c"))
    {
      g_param.option |= OPTION_PARAM_CONTROL;
      disable_state(YP_STATE_MOTOR);
      disable_state(YP_STATE_VELOCITY);
      disable_state(YP_STATE_BODY);
      disable_state(YP_STATE_TRACKING);
    }
    else if (!strcmp(argv[i], "--without-device"))
    {
      g_param.option |= OPTION_WITHOUT_DEVICE;
      g_param.option |= OPTION_DO_NOT_USE_YP;
      g_param.option |= OPTION_PARAM_CONTROL;
      disable_state(YP_STATE_MOTOR);
      disable_state(YP_STATE_VELOCITY);
      disable_state(YP_STATE_BODY);
      disable_state(YP_STATE_TRACKING);
    }
    else if (!strcmp(argv[i], "--high-resolution") ||
             !strcmp(argv[i], "--high-resolution=yes"))
    {
      g_param.option |= OPTION_HIGH_PREC;
    }
    else if (!strcmp(argv[i], "--high-resolution=no"))
    {
      g_param.option &= ~OPTION_HIGH_PREC;
    }
    else if (!strcmp(argv[i], "--version") || !strcmp(argv[i], "-v"))
    {
      g_param.option |= OPTION_VERSION;
    }
    else if (!strcmp(argv[i], "--verbose"))
    {
      g_param.output_lv = OUTPUT_LV_DEBUG;
    }
    else if (!strcmp(argv[i], "--quiet"))
    {
      g_param.output_lv = OUTPUT_LV_WARNING;
    }
    else if (!strcmp(argv[i], "--reconnect"))
    {
      g_param.option |= OPTION_RECONNECT;
    }
    else if (!strcmp(argv[i], "--enable-set-bs"))
    {
      g_param.option |= OPTION_ENABLE_SET_BS;
    }
    else if (!strcmp(argv[i], "--enable-get-digital-io"))
    {
      g_param.option |= OPTION_ENABLE_GET_DIGITAL_IO;
    }
    else if (!strcmp(argv[i], "--no-yp-protocol"))
    {
      g_param.option |= OPTION_DO_NOT_USE_YP;
    }
    else if (!strcmp(argv[i], "--without-ssm"))
    {
      g_param.option |= OPTION_WITHOUT_SSM;
    }
    else if (!strcmp(argv[i], "--msq-key") || !strcmp(argv[i], "-q"))
    {
      if (i + 1 < argc)
      {
        i++;
        g_param.msq_key = atoi(argv[i]);
      }
      else
        break;
    }
    else if (!strcmp(argv[i], "--speed") || !strcmp(argv[i], "-s"))
    {
      if (i + 1 < argc)
      {
        i++;
        g_param.speed = atoi(argv[i]);
      }
      else
        break;
    }
    else if (!strcmp(argv[i], "--passive"))
    {
      g_param.option |= OPTION_PASSIVE;
    }
    else if (!strcmp(argv[i], "--update-param"))
    {
      g_param.option |= OPTION_UPDATE_PARAM;
    }
    else if (!strcmp(argv[i], "--ssm-id"))
    {
      if (i + 1 < argc)
      {
        i++;
        g_param.ssm_id = atoi(argv[i]);
      }
      else
      {
        break;
      }
    }
    else if (!strcmp(argv[i], "--exit-on-time-jump"))
    {
      g_param.option |= OPTION_EXIT_ON_TIME_JUMP;
    }
    else
    {
      yprintf(OUTPUT_LV_ERROR, "ERROR : invalid option -- '%s'.\n", argv[i]);
      return 0;
    }
  }

  if (i < argc)
  {
    yprintf(OUTPUT_LV_ERROR, "ERROR :  option requires an argument -- '%s'.\n", argv[i]);
    return 0;
  }

  return 1;
}